

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

void scriptnum_tests::RunOperators(int64_t *num1,int64_t *num2)

{
  long lVar1;
  long in_FS_OFFSET;
  int64_t *in_stack_00000030;
  int64_t *in_stack_00000088;
  int64_t *in_stack_00000090;
  int64_t *in_stack_000000d0;
  int64_t *in_stack_000000d8;
  int64_t *in_stack_000003c0;
  int64_t *in_stack_000003c8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckAdd(in_stack_00000090,in_stack_00000088);
  CheckSubtract(in_stack_000000d8,in_stack_000000d0);
  CheckNegate(in_stack_00000030);
  CheckCompare(in_stack_000003c8,in_stack_000003c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void RunOperators(const int64_t& num1, const int64_t& num2)
{
    CheckAdd(num1, num2);
    CheckSubtract(num1, num2);
    CheckNegate(num1);
    CheckCompare(num1, num2);
}